

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5AsciiTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                     _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  code *in_R9;
  long in_FS_OFFSET;
  bool bVar3;
  int nByte;
  uchar *a;
  char *pFold;
  int nFold;
  int is;
  int ie;
  int rc;
  AsciiTokenizer *p;
  char aFold [64];
  sqlite3_uint64 in_stack_ffffffffffffff48;
  char *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  char local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_84 = 0;
  local_8c = 0;
  memset(local_48,0xaa,0x40);
  local_90 = 0x40;
  local_98 = local_48;
  do {
    if (in_R8D <= local_8c || local_84 != 0) {
LAB_00290117:
      if (local_98 != local_48) {
        sqlite3_free((void *)0x290130);
      }
      if (local_84 == 0x65) {
        local_84 = 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_84;
      }
      __stack_chk_fail();
    }
    while( true ) {
      bVar3 = false;
      if ((local_8c < in_R8D) && (bVar3 = false, ((int)*(char *)(in_RCX + local_8c) & 0x80U) == 0))
      {
        bVar3 = *(char *)(in_RDI + (int)*(char *)(in_RCX + local_8c)) == '\0';
      }
      if (!bVar3) break;
      local_8c = local_8c + 1;
    }
    iVar2 = local_8c;
    if (local_8c == in_R8D) goto LAB_00290117;
    do {
      iVar1 = iVar2;
      local_88 = iVar1 + 1;
      bVar3 = false;
      if ((local_88 < in_R8D) && (bVar3 = true, ((int)*(char *)(in_RCX + local_88) & 0x80U) == 0)) {
        bVar3 = *(char *)(in_RDI + (int)*(char *)(in_RCX + local_88)) != '\0';
      }
      iVar2 = local_88;
    } while (bVar3);
    iVar2 = local_88 - local_8c;
    if (local_90 < iVar2) {
      if (local_98 != local_48) {
        sqlite3_free((void *)0x290099);
      }
      local_98 = (char *)sqlite3_malloc64(in_stack_ffffffffffffff48);
      if (local_98 == (char *)0x0) {
        local_84 = 7;
        goto LAB_00290117;
      }
      local_90 = iVar2 * 2;
    }
    asciiFold(local_98,(char *)(in_RCX + local_8c),iVar2);
    local_84 = (*in_R9)(in_RSI,0,local_98,iVar2,local_8c,local_88);
    local_8c = iVar1 + 2;
  } while( true );
}

Assistant:

static int fts5AsciiTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  AsciiTokenizer *p = (AsciiTokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  int ie;
  int is = 0;

  char aFold[64];
  int nFold = sizeof(aFold);
  char *pFold = aFold;
  unsigned char *a = p->aTokenChar;

  UNUSED_PARAM(iUnused);

  while( is<nText && rc==SQLITE_OK ){
    int nByte;

    /* Skip any leading divider characters. */
    while( is<nText && ((pText[is]&0x80)==0 && a[(int)pText[is]]==0) ){
      is++;
    }
    if( is==nText ) break;

    /* Count the token characters */
    ie = is+1;
    while( ie<nText && ((pText[ie]&0x80) || a[(int)pText[ie]] ) ){
      ie++;
    }

    /* Fold to lower case */
    nByte = ie-is;
    if( nByte>nFold ){
      if( pFold!=aFold ) sqlite3_free(pFold);
      pFold = sqlite3_malloc64((sqlite3_int64)nByte*2);
      if( pFold==0 ){
        rc = SQLITE_NOMEM;
        break;
      }
      nFold = nByte*2;
    }
    asciiFold(pFold, &pText[is], nByte);

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, pFold, nByte, is, ie);
    is = ie+1;
  }

  if( pFold!=aFold ) sqlite3_free(pFold);
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}